

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4faa5c::GlobalQualifiedName::printLeft(GlobalQualifiedName *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = "::";
  OutputStream::operator+=(S,R);
  Node::print(this->Child,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "::";
    Child->print(S);
  }